

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O2

int __thiscall
JsUtil::
BaseDictionary<Js::FrameDisplay*,Js::FrameDisplay*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleHashedEntry,JsUtil::NoResizeLock>
::
Insert<(JsUtil::BaseDictionary<Js::FrameDisplay*,Js::FrameDisplay*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleHashedEntry,JsUtil::NoResizeLock>::InsertOperations)1>
          (BaseDictionary<Js::FrameDisplay*,Js::FrameDisplay*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleHashedEntry,JsUtil::NoResizeLock>
           *this,FrameDisplay **key,FrameDisplay **value)

{
  Type *pTVar1;
  uint uVar2;
  long lVar3;
  SimpleHashedEntry<Memory::WriteBarrierPtr<Js::FrameDisplay>,_Memory::WriteBarrierPtr<Js::FrameDisplay>_>
  *pSVar4;
  int *piVar5;
  code *pcVar6;
  BaseDictionary<Js::FrameDisplay_*,_Js::FrameDisplay_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  *this_00;
  bool bVar7;
  int iVar8;
  uint uVar9;
  undefined4 *puVar10;
  ulong uVar11;
  uint uVar12;
  WriteBarrierPtr<Js::FrameDisplay> *pWVar13;
  long lVar14;
  uint uVar15;
  WriteBarrierPtr<Js::FrameDisplay> local_68;
  FrameDisplay **local_60;
  WriteBarrierPtr<Js::FrameDisplay> local_58;
  FrameDisplay **local_50;
  ulong local_48;
  BaseDictionary<Js::FrameDisplay_*,_Js::FrameDisplay_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  *local_40;
  uint local_34;
  
  lVar14 = *(long *)this;
  local_60 = value;
  if (lVar14 == 0) {
    BaseDictionary<Js::FrameDisplay_*,_Js::FrameDisplay_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
    ::Initialize((BaseDictionary<Js::FrameDisplay_*,_Js::FrameDisplay_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                  *)this,0);
    lVar14 = *(long *)this;
  }
  uVar15 = (uint)((ulong)*key >> 3) | 1;
  local_50 = key;
  local_34 = BaseDictionary<Js::FrameDisplay_*,_Js::FrameDisplay_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
             ::GetBucket((BaseDictionary<Js::FrameDisplay_*,_Js::FrameDisplay_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                          *)this,uVar15);
  lVar3 = *(long *)(this + 8);
  uVar12 = 0;
  local_40 = (BaseDictionary<Js::FrameDisplay_*,_Js::FrameDisplay_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
              *)this;
  for (pWVar13 = (WriteBarrierPtr<Js::FrameDisplay> *)(lVar14 + (ulong)local_34 * 4);
      this_00 = local_40, -1 < (long)*(int *)&pWVar13->ptr; pWVar13 = pWVar13 + 1) {
    pWVar13 = (WriteBarrierPtr<Js::FrameDisplay> *)((long)*(int *)&pWVar13->ptr * 0x10 + lVar3);
    ValueToKey<Memory::WriteBarrierPtr<Js::FrameDisplay>,_Memory::WriteBarrierPtr<Js::FrameDisplay>_>
    ::ToKey((ValueToKey<Memory::WriteBarrierPtr<Js::FrameDisplay>,_Memory::WriteBarrierPtr<Js::FrameDisplay>_>
             *)&local_58,pWVar13);
    if (local_58.ptr == *local_50) {
      if (local_40->stats == (DictionaryStats *)0x0) {
        return -1;
      }
      DictionaryStats::Lookup(local_40->stats,uVar12);
      return -1;
    }
    uVar12 = uVar12 + 1;
  }
  if (local_40->stats != (DictionaryStats *)0x0) {
    DictionaryStats::Lookup(local_40->stats,uVar12);
  }
  if (this_00->freeCount == 0) {
    uVar9 = this_00->size;
    uVar2 = this_00->count;
    if (uVar2 == uVar9) {
      BaseDictionary<Js::FrameDisplay_*,_Js::FrameDisplay_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
      ::Resize(this_00);
      local_34 = BaseDictionary<Js::FrameDisplay_*,_Js::FrameDisplay_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                 ::GetBucket(this_00,uVar15);
      uVar9 = this_00->size;
      uVar2 = this_00->count;
    }
    uVar11 = (ulong)uVar2;
    this_00->count = uVar2 + 1;
    if ((int)uVar9 < (int)(uVar2 + 1)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar10 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                         ,0x3f1,"(count <= size)","count <= size");
      if (!bVar7) goto LAB_00823b3b;
      *puVar10 = 0;
      uVar9 = this_00->size;
    }
    if ((int)uVar9 <= (int)uVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar10 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                         ,0x3f2,"(index < size)","index < size");
      if (!bVar7) goto LAB_00823b3b;
      *puVar10 = 0;
    }
  }
  else {
    if (this_00->freeCount < 1) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar10 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                         ,0x3d4,"(freeCount > 0)","freeCount > 0");
      if (!bVar7) goto LAB_00823b3b;
      *puVar10 = 0;
    }
    uVar15 = this_00->freeList;
    if ((int)uVar15 < 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar10 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                         ,0x3d5,"(freeList >= 0)","freeList >= 0");
      if (!bVar7) goto LAB_00823b3b;
      *puVar10 = 0;
      uVar15 = this_00->freeList;
    }
    if (this_00->count <= (int)uVar15) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar10 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                         ,0x3d6,"(freeList < count)","freeList < count");
      if (!bVar7) {
LAB_00823b3b:
        pcVar6 = (code *)invalidInstructionException();
        (*pcVar6)();
      }
      *puVar10 = 0;
      uVar15 = this_00->freeList;
    }
    uVar11 = (ulong)uVar15;
    pTVar1 = &this_00->freeCount;
    *pTVar1 = *pTVar1 + -1;
    if (*pTVar1 != 0) {
      iVar8 = BaseDictionary<Js::FrameDisplay_*,_Js::FrameDisplay_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
              ::GetNextFreeEntryIndex((this_00->entries).ptr + (int)uVar15);
      this_00->freeList = iVar8;
    }
  }
  local_48._0_4_ = (int)uVar11;
  iVar8 = (int)local_48;
  lVar14 = (long)(int)local_48;
  pSVar4 = (this_00->entries).ptr;
  local_48 = uVar11;
  Memory::WriteBarrierPtr<Js::FrameDisplay>::WriteBarrierSet(&local_58,*local_50);
  Memory::WriteBarrierPtr<Js::FrameDisplay>::WriteBarrierSet(&local_68,*local_60);
  Memory::WriteBarrierPtr<Js::FrameDisplay>::WriteBarrierSet
            ((WriteBarrierPtr<Js::FrameDisplay> *)(pSVar4 + lVar14),local_68.ptr);
  piVar5 = (this_00->buckets).ptr;
  pSVar4 = (this_00->entries).ptr;
  pSVar4[lVar14].
  super_DefaultHashedEntry<Memory::WriteBarrierPtr<Js::FrameDisplay>,_Memory::WriteBarrierPtr<Js::FrameDisplay>,_JsUtil::(anonymous_namespace)::ImplicitKeyValueEntry>
  .
  super_ImplicitKeyValueEntry<Memory::WriteBarrierPtr<Js::FrameDisplay>,_Memory::WriteBarrierPtr<Js::FrameDisplay>_>
  .
  super_ValueEntry<Memory::WriteBarrierPtr<Js::FrameDisplay>,_JsUtil::(anonymous_namespace)::ValueEntryData<Memory::WriteBarrierPtr<Js::FrameDisplay>_>_>
  .super_ValueEntryData<Memory::WriteBarrierPtr<Js::FrameDisplay>_>.next = piVar5[local_34];
  piVar5[local_34] = iVar8;
  iVar8 = (int)local_48;
  uVar12 = 0;
  uVar11 = local_48 & 0xffffffff;
  do {
    uVar15 = pSVar4[(int)uVar11].
             super_DefaultHashedEntry<Memory::WriteBarrierPtr<Js::FrameDisplay>,_Memory::WriteBarrierPtr<Js::FrameDisplay>,_JsUtil::(anonymous_namespace)::ImplicitKeyValueEntry>
             .
             super_ImplicitKeyValueEntry<Memory::WriteBarrierPtr<Js::FrameDisplay>,_Memory::WriteBarrierPtr<Js::FrameDisplay>_>
             .
             super_ValueEntry<Memory::WriteBarrierPtr<Js::FrameDisplay>,_JsUtil::(anonymous_namespace)::ValueEntryData<Memory::WriteBarrierPtr<Js::FrameDisplay>_>_>
             .super_ValueEntryData<Memory::WriteBarrierPtr<Js::FrameDisplay>_>.next;
    uVar11 = (ulong)uVar15;
    uVar12 = uVar12 + 1;
  } while (uVar15 != 0xffffffff);
  if (local_40->stats != (DictionaryStats *)0x0) {
    DictionaryStats::Insert(local_40->stats,uVar12);
  }
  return iVar8;
}

Assistant:

int Insert(const TKey& key, const TValue& value)
        {
            int * localBuckets = buckets;
            if (localBuckets == nullptr)
            {
                Initialize(0);
                localBuckets = buckets;
            }

#if DBG || PROFILE_DICTIONARY
            // Always search and verify
            const bool needSearch = true;
#else
            const bool needSearch = (op != Insert_Add);
#endif
            hash_t hashCode = GetHashCode(key);
            uint targetBucket = this->GetBucket(hashCode);
            if (needSearch)
            {
#if PROFILE_DICTIONARY
                uint depth = 0;
#endif
                EntryType * localEntries = entries;
                for (int i = localBuckets[targetBucket]; i >= 0; i = localEntries[i].next)
                {
                    if (localEntries[i].template KeyEquals<Comparer<TKey>>(key, hashCode))
                    {
#if PROFILE_DICTIONARY
                        if (stats)
                            stats->Lookup(depth);
#endif
                        Assert(op != Insert_Add);
                        if (op == Insert_Item)
                        {
                            localEntries[i].SetValue(value);
                            return i;
                        }
                        return -1;
                    }
#if PROFILE_DICTIONARY
                    depth += 1;
#endif
                }

#if PROFILE_DICTIONARY
                if (stats)
                    stats->Lookup(depth);
#endif
            }

            // Ideally we'd do cleanup only if weak references have been collected since the last resize
            // but that would require us to use an additional field to store the last recycler cleanup id
            // that we saw
            // We can add that optimization later if we have to.
            if (EntryType::SupportsCleanup() && freeCount == 0 && count == size)
            {
                this->MapAndRemoveIf([](EntryType& entry)
                {
                    return EntryType::NeedsCleanup(entry);
                });
            }

            int index;
            if (freeCount != 0)
            {
                Assert(freeCount > 0);
                Assert(freeList >= 0);
                Assert(freeList < count);
                index = freeList;
                freeCount--;
                if(freeCount != 0)
                {
                    freeList = GetNextFreeEntryIndex(entries[index]);
                }
            }
            else
            {
                // If there's nothing free, then in general, we set index to count, and increment count
                // If we resize, we also need to recalculate the target
                // However, if cleanup is supported, then before resize, we should try and clean up and see
                // if something got freed, and if it did, reuse that index
                if (count == size)
                {
                    Resize();
                    targetBucket = this->GetBucket(hashCode);
                    index = count;
                    count++;
                }
                else
                {
                    index = count;
                    count++;
                }

                Assert(count <= size);
                Assert(index < size);
            }

            entries[index].Set(key, value, hashCode);
            entries[index].next = buckets[targetBucket];
            buckets[targetBucket] = index;

#if PROFILE_DICTIONARY
            int profileIndex = index;
            uint depth = 1;  // need to recalculate depth in case there was a resize (also 1-based for stats->Insert)
            while(entries[profileIndex].next != -1)
            {
                profileIndex = entries[profileIndex].next;
                ++depth;
            }
            if (stats)
                stats->Insert(depth);
#endif
            return index;
        }